

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void __thiscall
fe::operations::op_blend_one_invSrcAlpha::operator()
          (op_blend_one_invSrcAlpha *this,PixelDISTANCE *srcPixelFormat,
          PixelB8G8R8A8 *destPixelFormat,uchar *srcData,uchar *destData,int x,int y)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  byte bVar7;
  undefined8 in_RAX;
  short sVar8;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Pixel s;
  anon_union_4_3_3c41bd51_for_Pixel_0 local_14;
  
  local_14.rgba = (uint)((ulong)in_RAX >> 0x20);
  PixelDISTANCE::getPixel(srcPixelFormat,srcData,(Pixel *)&local_14.field_0,x,y);
  uVar1 = *(undefined4 *)destData;
  bVar7 = ~local_14._3_1_;
  uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar5;
  auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar3[8] = (char)((uint)uVar1 >> 0x10);
  auVar3._0_8_ = uVar5;
  auVar3[9] = 0;
  auVar3._10_3_ = auVar2._10_3_;
  auVar6._5_8_ = 0;
  auVar6._0_5_ = auVar3._8_5_;
  auVar15._0_4_ = (undefined4)uVar5;
  auVar4[4] = (char)((uint)uVar1 >> 8);
  auVar4._0_4_ = auVar15._0_4_;
  auVar4[5] = 0;
  auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
  auVar15._4_9_ = auVar4._4_9_;
  auVar15._13_3_ = 0;
  auVar14._1_3_ = 0;
  auVar14[0] = bVar7;
  auVar14[4] = bVar7;
  auVar14._5_3_ = 0;
  auVar14[8] = bVar7;
  auVar14._9_3_ = 0;
  auVar14[0xc] = bVar7;
  auVar14._13_3_ = 0;
  auVar14 = pmaddwd(auVar14,auVar15);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  local_14._3_1_ << 0x30) >> 0x28),
                                                  CONCAT14(local_14._2_1_,local_14.rgba)) >> 0x20),
                                                  local_14.rgba) >> 0x18),
                                                 CONCAT12(local_14._1_1_,(short)local_14.rgba)) >>
                                       0x10),(short)local_14.rgba) & 0xffff00ff00ff00ff;
  auVar9 = pshuflw(auVar9,auVar9,0xc6);
  auVar10._0_2_ = auVar9._0_2_ + auVar14._0_2_ / 0xff;
  auVar10._2_2_ = auVar9._2_2_ + auVar14._4_2_ / 0xff;
  auVar10._4_2_ = auVar9._4_2_ + auVar14._8_2_ / 0xff;
  auVar10._6_2_ = auVar9._6_2_ + auVar14._12_2_ / 0xff;
  auVar10._8_2_ = auVar9._8_2_;
  auVar10._10_2_ = auVar9._10_2_;
  auVar10._12_2_ = auVar9._12_2_;
  auVar10._14_2_ = auVar9._14_2_;
  auVar9 = psubusw(auVar10,_DAT_00119120);
  sVar8 = auVar10._0_2_ - auVar9._0_2_;
  sVar11 = auVar10._2_2_ - auVar9._2_2_;
  sVar12 = auVar10._4_2_ - auVar9._4_2_;
  sVar13 = auVar10._6_2_ - auVar9._6_2_;
  *(uint *)destData =
       CONCAT13((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13),
                CONCAT12((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12),
                         CONCAT11((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11),
                                  (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8))));
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel s;
                srcPixelFormat.getPixel(srcData, s, OPERATOR_ARGS_PASS);

                Pixel d;
                destPixelFormat.getPixel(destData, d, OPERATOR_ARGS_PASS);

#define M(v) v < 255 ? v : 255;
                unsigned char ia = 255 - s.a;
                Pixel r;
                r.r = M((d.r * ia) / 255 + s.r);
                r.g = M((d.g * ia) / 255 + s.g);
                r.b = M((d.b * ia) / 255 + s.b);
                r.a = M((d.a * ia) / 255 + s.a);
#undef  M

                destPixelFormat.setPixel(destData, r);
            }